

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O2

void pm_flush_sysex(PmInternal *midi,PmTimestamp timestamp)

{
  PmError PVar1;
  PmEvent event;
  PmMessage local_10;
  PmTimestamp local_c;
  
  if (midi->sysex_message_count != 0) {
    local_10 = midi->sysex_message;
    local_c = timestamp;
    PVar1 = Pm_Enqueue(midi->queue,&local_10);
    if (PVar1 == pmBufferOverflow) {
      midi->sysex_in_progress = 0;
    }
    midi->sysex_message = 0;
    midi->sysex_message_count = 0;
  }
  return;
}

Assistant:

static void pm_flush_sysex(PmInternal *midi, PmTimestamp timestamp)
{
    PmEvent event;
    
    /* there may be nothing in the buffer */
    if (midi->sysex_message_count == 0) return; /* nothing to flush */
    
    event.message = midi->sysex_message;
    event.timestamp = timestamp;
    /* copied from pm_read_short, avoids filtering */
    if (Pm_Enqueue(midi->queue, &event) == pmBufferOverflow) {
        midi->sysex_in_progress = FALSE;
    }
    midi->sysex_message_count = 0;
    midi->sysex_message = 0;
}